

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O0

void __thiscall agge::tests::RendererTests::SubpixelPrecisionShiftIsRespected(RendererTests *this)

{
  bypass_alpha *this_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  cell *pcVar4;
  bool bVar5;
  allocator local_201;
  string local_200 [32];
  LocationInfo local_1e0;
  undefined1 auStack_1b8 [8];
  span reference2 [3];
  string local_180 [32];
  LocationInfo local_160;
  undefined1 auStack_138 [8];
  span reference1 [3];
  bypass_alpha local_e9;
  undefined1 local_e8 [8];
  cell cells [3];
  undefined1 local_b8 [8];
  scanline_mockup sl;
  RendererTests *this_local;
  int len;
  int cover_m;
  int area;
  int x;
  cell *i;
  int cover;
  int len_1;
  int cover_m_1;
  int area_1;
  int x_1;
  cell *i_1;
  int cover_1;
  
  sl._32_8_ = this;
  anon_unknown_1::scanline_mockup::scanline_mockup((scanline_mockup *)local_b8,true);
  memset(local_e8,0,0x24);
  cells[0].x = 0x11;
  cells[0].area = 0xb;
  cells[0].cover = 0x1c00;
  cells[1].area = 0xd;
  cells[2].x = -0x11;
  _area = begin<agge::tests::mocks::cell,3ul>((cell (*) [3])local_e8);
  pcVar4 = end<agge::tests::mocks::cell,3ul>((cell (*) [3])local_e8);
  i._4_4_ = 0;
  if (_area != pcVar4) {
    while( true ) {
      cover_m = _area->x;
      len = 0;
      do {
        len = _area->area + len;
        i._4_4_ = _area->cover + i._4_4_;
        _area = _area + 1;
        bVar5 = false;
        if (_area != pcVar4) {
          bVar5 = _area->x == cover_m;
        }
      } while (bVar5);
      iVar1 = i._4_4_ * 0x100;
      if (len != 0) {
        uVar2 = anon_unknown_1::bypass_alpha::operator()(&local_e9,iVar1 - len);
        anon_unknown_1::scanline_mockup::add_cell((scanline_mockup *)local_b8,cover_m,uVar2);
        cover_m = cover_m + 1;
      }
      if (_area == pcVar4) break;
      iVar3 = _area->x - cover_m;
      if ((iVar3 != 0) && (iVar1 != 0)) {
        uVar2 = anon_unknown_1::bypass_alpha::operator()(&local_e9,iVar1);
        anon_unknown_1::scanline_mockup::add_span((scanline_mockup *)local_b8,cover_m,iVar3,uVar2);
      }
    }
  }
  reference1[1].length = 0x7fffffff;
  reference1[1].cover = 0xc;
  reference1[2].y = 1;
  reference1[2].x = 0x1100;
  reference1[0].length = 0x7fffffff;
  reference1[0].cover = 0xb;
  reference1[1].y = 0;
  reference1[1].x = -0xb00;
  auStack_138._0_4_ = 0x7fffffff;
  auStack_138._4_4_ = 0;
  reference1[0].y = 0xb;
  reference1[0].x = 0x1100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,(allocator *)((long)&reference2[2].cover + 3));
  ut::LocationInfo::LocationInfo(&local_160,(string *)local_180,0x14c);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,3ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((span (*) [3])auStack_138,
             (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              *)&sl,&local_160);
  ut::LocationInfo::~LocationInfo(&local_160);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&reference2[2].cover + 3));
  std::
  vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ::clear((vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
           *)&sl);
  _area_1 = begin<agge::tests::mocks::cell,3ul>((cell (*) [3])local_e8);
  pcVar4 = end<agge::tests::mocks::cell,3ul>((cell (*) [3])local_e8);
  this_00 = (bypass_alpha *)((long)&reference2[2].cover + 2);
  i_1._4_4_ = 0;
  if (_area_1 != pcVar4) {
    while( true ) {
      cover_m_1 = _area_1->x;
      len_1 = 0;
      do {
        len_1 = _area_1->area + len_1;
        i_1._4_4_ = _area_1->cover + i_1._4_4_;
        _area_1 = _area_1 + 1;
        bVar5 = false;
        if (_area_1 != pcVar4) {
          bVar5 = _area_1->x == cover_m_1;
        }
      } while (bVar5);
      iVar1 = i_1._4_4_ * 0x800;
      if (len_1 != 0) {
        uVar2 = anon_unknown_1::bypass_alpha::operator()(this_00,iVar1 - len_1);
        anon_unknown_1::scanline_mockup::add_cell((scanline_mockup *)local_b8,cover_m_1,uVar2);
        cover_m_1 = cover_m_1 + 1;
      }
      if (_area_1 == pcVar4) break;
      iVar3 = _area_1->x - cover_m_1;
      if ((iVar3 != 0) && (iVar1 != 0)) {
        uVar2 = anon_unknown_1::bypass_alpha::operator()(this_00,iVar1);
        anon_unknown_1::scanline_mockup::add_span((scanline_mockup *)local_b8,cover_m_1,iVar3,uVar2)
        ;
      }
    }
  }
  reference2[1].length = 0x7fffffff;
  reference2[1].cover = 0xc;
  reference2[2].y = 1;
  reference2[2].x = 0x8800;
  reference2[0].length = 0x7fffffff;
  reference2[0].cover = 0xb;
  reference2[1].y = 0;
  reference2[1].x = 0x6c00;
  auStack_1b8._0_4_ = 0x7fffffff;
  auStack_1b8._4_4_ = 0;
  reference2[0].y = 0xb;
  reference2[0].x = 0x8800;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_201);
  ut::LocationInfo::LocationInfo(&local_1e0,(string *)local_200,0x15b);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,3ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((span (*) [3])auStack_1b8,
             (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              *)&sl,&local_1e0);
  ut::LocationInfo::~LocationInfo(&local_1e0);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  anon_unknown_1::scanline_mockup::~scanline_mockup((scanline_mockup *)local_b8);
  return;
}

Assistant:

test( SubpixelPrecisionShiftIsRespected )
			{
				// INIT
				scanline_mockup sl;
				mocks::cell cells[] = { { 0, 0, 17 }, { 11, 14 * 512, 0 }, { 13, 0, -17 }, };

				// ACT
				sweep_scanline<7>(sl, begin(cells), end(cells), bypass_alpha());

				// ASSERT
				span reference1[] = {
					{ 0x7fffffff, 0, 11, 17 * 256 },
					{ 0x7fffffff, 11, 0, 17 * 256 - 14 * 512 },
					{ 0x7fffffff, 12, 1, 17 * 256 },
				};

				assert_equal(reference1, sl.spans_log);

				// INIT
				sl.spans_log.clear();

				// ACT
				sweep_scanline<10>(sl, begin(cells), end(cells), bypass_alpha());

				// ASSERT
				span reference2[] = {
					{ 0x7fffffff, 0, 11, 17 * 2048 },
					{ 0x7fffffff, 11, 0, 17 * 2048 - 14 * 512 },
					{ 0x7fffffff, 12, 1, 17 * 2048 },
				};

				assert_equal(reference2, sl.spans_log);
			}